

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  bool bVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  string *psVar4;
  size_type sVar5;
  int local_b8;
  LogFinisher local_b2;
  byte local_b1;
  int i;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *detached_comments_local;
  string *trailing_local;
  string *leading_local;
  LocationRecorder *this_local;
  
  local_28 = detached_comments;
  detached_comments_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)trailing;
  trailing_local = leading;
  leading_local = (string *)this;
  bVar1 = SourceCodeInfo_Location::has_leading_comments(this->location_);
  local_61 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x198);
    local_61 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=(local_75,pLVar2);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  bVar1 = SourceCodeInfo_Location::has_trailing_comments(this->location_);
  local_b1 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&i,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x199);
    local_b1 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&i,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_b2,pLVar2);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)&i);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = SourceCodeInfo_Location::mutable_leading_comments_abi_cxx11_(this->location_);
    std::__cxx11::string::swap((string *)psVar4);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = SourceCodeInfo_Location::mutable_trailing_comments_abi_cxx11_(this->location_);
    std::__cxx11::string::swap((string *)psVar4);
  }
  for (local_b8 = 0;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_28), (ulong)(long)local_b8 < sVar5; local_b8 = local_b8 + 1) {
    psVar4 = SourceCodeInfo_Location::add_leading_detached_comments_abi_cxx11_(this->location_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_28,(long)local_b8);
    std::__cxx11::string::swap((string *)psVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_28);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    string* leading, string* trailing,
    std::vector<string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap(
        (*detached_comments)[i]);
  }
  detached_comments->clear();
}